

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(ot::commissioner::JoinerType,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Invoke(Result *__return_storage_ptr__,
        FunctionMocker<ot::commissioner::Error_(ot::commissioner::JoinerType,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *this,JoinerType args,unsigned_long args_1,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  ArgumentTuple tuple;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  unsigned_long local_20;
  JoinerType local_18;
  
  local_30 = args_3;
  local_28 = args_2;
  local_20 = args_1;
  local_18 = args;
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&local_30)
  ;
  pAVar1 = DownCast_<testing::internal::ActionResultHolder<ot::commissioner::Error>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  ot::commissioner::Error::Error(__return_storage_ptr__,&(pAVar1->result_).value_);
  if (pAVar1 != (ActionResultHolder<ot::commissioner::Error> *)0x0) {
    (*(pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }